

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305_vec.cc
# Opt level: O1

void CRYPTO_poly1305_finish(poly1305_state *state,uint8_t *mac)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  int iVar33;
  uint uVar34;
  ulong *puVar35;
  ulong uVar36;
  uint uVar38;
  undefined1 auVar37 [16];
  ulong uVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  undefined1 auVar43 [12];
  uint uVar45;
  undefined1 auVar44 [16];
  ulong uVar46;
  uint uVar47;
  undefined1 auVar48 [12];
  uint uVar51;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ulong uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  ulong uVar63;
  ulong uVar64;
  undefined1 auVar65 [16];
  ulong uVar66;
  undefined1 auVar67 [16];
  ulong uVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar73;
  undefined1 auVar72 [16];
  ulong local_98;
  ulong uStack_90;
  undefined1 local_88 [16];
  undefined1 auVar71 [12];
  
  uVar32 = (ulong)(*state + 0x3f) & 0xffffffffffffffc0;
  uVar30 = *(ulong *)(uVar32 + 0x178);
  puVar35 = (ulong *)(uVar32 + 0x180);
  if (*(long *)(uVar32 + 0x170) != 0) {
    auVar37 = *(undefined1 (*) [16])(uVar32 + 0x120);
    auVar44 = *(undefined1 (*) [16])(uVar32 + 0x130);
    auVar71 = auVar44._0_12_;
    auVar49 = *(undefined1 (*) [16])(uVar32 + 0x140);
    auVar43 = auVar49._0_12_;
    auVar50 = *(undefined1 (*) [16])(uVar32 + 0x150);
    auVar48 = auVar50._0_12_;
    uVar29 = *(uint *)(uVar32 + 0x160);
    local_98 = *(ulong *)(uVar32 + 0x160);
    uVar31 = *(uint *)(uVar32 + 0x168);
    uStack_90 = *(ulong *)(uVar32 + 0x168);
    if (uVar30 < 0x20) {
      lVar28 = 0;
    }
    else {
      uVar39 = *(ulong *)(uVar32 + 0x90);
      uVar58 = *(ulong *)(uVar32 + 0x98);
      uVar42 = *(ulong *)(uVar32 + 0xa0);
      uVar64 = *(ulong *)(uVar32 + 0xa8);
      uVar41 = *(ulong *)(uVar32 + 0xb0);
      uVar66 = *(ulong *)(uVar32 + 0xb8);
      uVar34 = auVar37._0_4_;
      uVar38 = auVar37._8_4_;
      uVar25 = *(ulong *)(uVar32 + 0x110);
      uVar26 = *(ulong *)(uVar32 + 0x118);
      uVar70 = auVar44._0_4_;
      uVar73 = auVar44._8_4_;
      uVar27 = *(ulong *)(uVar32 + 0x100);
      uVar46 = *(ulong *)(uVar32 + 0x108);
      uVar40 = auVar49._0_4_;
      uVar45 = auVar49._8_4_;
      uVar47 = auVar50._0_4_;
      uVar51 = auVar50._8_4_;
      uVar36 = *(ulong *)(uVar32 + 400);
      uVar57 = *(ulong *)(uVar32 + 0x180);
      auVar60._8_8_ = uVar36;
      auVar60._0_8_ = uVar57;
      auVar49._0_8_ =
           SUB168(auVar60 & _DAT_005cd7a0,0) +
           (*(ulong *)(uVar32 + 0xe0) & 0xffffffff) * (ulong)uVar29 +
           (*(ulong *)(uVar32 + 0xf0) & 0xffffffff) * (ulong)uVar47 +
           (uVar27 & 0xffffffff) * (ulong)uVar40 +
           (uVar25 & 0xffffffff) * (ulong)uVar70 + (uVar39 & 0xffffffff) * (ulong)uVar34;
      auVar49._8_8_ =
           SUB168(auVar60 & _DAT_005cd7a0,8) +
           (*(ulong *)(uVar32 + 0xe8) & 0xffffffff) * (ulong)uVar31 +
           (*(ulong *)(uVar32 + 0xf8) & 0xffffffff) * (ulong)uVar51 +
           (uVar46 & 0xffffffff) * (ulong)uVar45 +
           (uVar26 & 0xffffffff) * (ulong)uVar73 + (uVar58 & 0xffffffff) * (ulong)uVar38;
      auVar67._0_8_ = uVar57 >> 0x1a;
      auVar67._8_8_ = uVar36 >> 0x1a;
      auVar61._0_8_ = uVar57 >> 0x34;
      auVar61._8_8_ = uVar36 >> 0x34;
      auVar53._0_8_ = *(ulong *)(uVar32 + 0x188) << 0xc;
      auVar53._8_8_ = *(ulong *)(uVar32 + 0x198) << 0xc;
      auVar53 = auVar53 | auVar61;
      auVar54._0_8_ = auVar53._0_8_ >> 0x1a;
      auVar54._8_8_ = auVar53._8_8_ >> 0x1a;
      local_88._0_8_ = auVar37._0_8_;
      auVar55._0_8_ =
           SUB168(auVar54 & _DAT_005cd7a0,0) + (uVar25 & 0xffffffff) * (ulong)uVar29 +
           (uVar39 & 0xffffffff) * (ulong)uVar47 + (uVar42 & 0xffffffff) * (ulong)uVar40 +
           (uVar41 & 0xffffffff) * (ulong)uVar70 +
           (*(ulong *)(uVar32 + 0xc0) & 0xffffffff) * (ulong)uVar34;
      auVar55._8_8_ =
           SUB168(auVar54 & _DAT_005cd7a0,8) + (uVar26 & 0xffffffff) * (ulong)uVar31 +
           (uVar58 & 0xffffffff) * (ulong)uVar51 + (uVar64 & 0xffffffff) * (ulong)uVar45 +
           (uVar66 & 0xffffffff) * (ulong)uVar73 +
           (*(ulong *)(uVar32 + 200) & 0xffffffff) * (ulong)uVar38;
      auVar65._0_8_ =
           (auVar49._0_8_ >> 0x1a) +
           SUB168(auVar67 & _DAT_005cd7a0,0) +
           (*(ulong *)(uVar32 + 0xf0) & 0xffffffff) * (ulong)uVar29 +
           (uVar27 & 0xffffffff) * (ulong)uVar47 + (uVar25 & 0xffffffff) * (ulong)uVar40 +
           (uVar39 & 0xffffffff) * (ulong)uVar70 + (uVar42 & 0xffffffff) * (ulong)uVar34;
      auVar65._8_8_ =
           (auVar49._8_8_ >> 0x1a) +
           SUB168(auVar67 & _DAT_005cd7a0,8) +
           (*(ulong *)(uVar32 + 0xf8) & 0xffffffff) * (ulong)uVar31 +
           (uVar46 & 0xffffffff) * (ulong)uVar51 + (uVar26 & 0xffffffff) * (ulong)uVar45 +
           (uVar58 & 0xffffffff) * (ulong)uVar73 + (uVar64 & 0xffffffff) * (ulong)uVar38;
      auVar62._0_8_ =
           (auVar55._0_8_ >> 0x1a) +
           (*(ulong *)(uVar32 + 0x188) >> 0x28) +
           (local_88._0_8_ & 0xffffffff) * (ulong)*(uint *)(uVar32 + 0xd0) +
           (uVar39 & 0xffffffff) * (ulong)uVar29 + (uVar42 & 0xffffffff) * (ulong)uVar47 +
           (uVar41 & 0xffffffff) * (ulong)uVar40 +
           (*(ulong *)(uVar32 + 0xc0) & 0xffffffff) * (ulong)uVar70 + 0x1000000;
      auVar62._8_8_ =
           (auVar55._8_8_ >> 0x1a) +
           (*(ulong *)(uVar32 + 0x198) >> 0x28) +
           (auVar37._8_8_ & 0xffffffff) * (ulong)*(uint *)(uVar32 + 0xd8) +
           (uVar58 & 0xffffffff) * (ulong)uVar31 + (uVar64 & 0xffffffff) * (ulong)uVar51 +
           (uVar66 & 0xffffffff) * (ulong)uVar45 +
           (*(ulong *)(uVar32 + 200) & 0xffffffff) * (ulong)uVar73 + 0x1000000;
      auVar44._0_8_ =
           (auVar65._0_8_ >> 0x1a) +
           SUB168(auVar53 & _DAT_005cd7a0,0) + (uVar27 & 0xffffffff) * (ulong)uVar29 +
           (uVar25 & 0xffffffff) * (ulong)uVar47 + (uVar41 & 0xffffffff) * (ulong)uVar34 +
           (uVar39 & 0xffffffff) * (ulong)uVar40 + (uVar42 & 0xffffffff) * (ulong)uVar70;
      auVar44._8_8_ =
           (auVar65._8_8_ >> 0x1a) +
           SUB168(auVar53 & _DAT_005cd7a0,8) + (uVar46 & 0xffffffff) * (ulong)uVar31 +
           (uVar26 & 0xffffffff) * (ulong)uVar51 + (uVar66 & 0xffffffff) * (ulong)uVar38 +
           (uVar58 & 0xffffffff) * (ulong)uVar45 + (uVar64 & 0xffffffff) * (ulong)uVar73;
      auVar37._0_8_ = (auVar62._0_8_ >> 0x1a & 0xffffffff) * 5 + SUB168(auVar49 & _DAT_005cd7a0,0);
      auVar37._8_8_ = (auVar62._8_8_ >> 0x1a & 0xffffffff) * 5 + SUB168(auVar49 & _DAT_005cd7a0,8);
      auVar50._0_8_ = (auVar44._0_8_ >> 0x1a) + SUB168(auVar55 & _DAT_005cd7a0,0);
      auVar50._8_8_ = (auVar44._8_8_ >> 0x1a) + SUB168(auVar55 & _DAT_005cd7a0,8);
      auVar72._0_8_ = (auVar37._0_8_ >> 0x1a) + SUB168(auVar65 & _DAT_005cd7a0,0);
      auVar72._8_8_ = (auVar37._8_8_ >> 0x1a) + SUB168(auVar65 & _DAT_005cd7a0,8);
      auVar71 = auVar72._0_12_;
      local_98 = (auVar50._0_8_ >> 0x1a) + SUB168(auVar62 & _DAT_005cd7a0,0);
      uStack_90 = (auVar50._8_8_ >> 0x1a) + SUB168(auVar62 & _DAT_005cd7a0,8);
      auVar43 = auVar44._0_12_ & DAT_005cd7a0._0_12_;
      auVar37 = auVar37 & _DAT_005cd7a0;
      auVar48 = auVar50._0_12_ & DAT_005cd7a0._0_12_;
      lVar28 = 0x20;
    }
    *(uint *)(uVar32 + 0x98) = *(uint *)(uVar32 + 0x94) & 0x3ffffff;
    uVar31 = ((uint)(CONCAT44(*(undefined4 *)(uVar32 + 0x9c),*(uint *)(uVar32 + 0x94)) >> 0x1a) |
             *(int *)(uVar32 + 0xa4) << 0x12) & 0x3ffffff;
    *(uint *)(uVar32 + 0xa8) = uVar31;
    uVar29 = (uint)(CONCAT44(*(uint *)(uVar32 + 0xac),*(int *)(uVar32 + 0xa4)) >> 8) & 0x3ffffff;
    *(uint *)(uVar32 + 0xb8) = uVar29;
    uVar34 = (*(int *)(uVar32 + 0xb4) << 10 | *(uint *)(uVar32 + 0xac) >> 2) & 0x3ffffff;
    *(uint *)(uVar32 + 200) = uVar34;
    iVar33 = (int)(CONCAT44(*(undefined4 *)(uVar32 + 0xbc),*(int *)(uVar32 + 0xb4)) >> 0x10);
    *(int *)(uVar32 + 0xd8) = iVar33;
    *(uint *)(uVar32 + 0xe8) = uVar31 * 5;
    *(uint *)(uVar32 + 0xf8) = uVar29 * 5;
    *(uint *)(uVar32 + 0x108) = uVar34 * 5;
    *(int *)(uVar32 + 0x118) = iVar33 * 5;
    uVar36 = *(ulong *)(uVar32 + 0x90);
    uVar57 = *(ulong *)(uVar32 + 0x98);
    uVar29 = auVar37._0_4_;
    uVar31 = auVar37._8_4_;
    uVar39 = *(ulong *)(uVar32 + 0xa0);
    uVar58 = *(ulong *)(uVar32 + 0xa8);
    uVar42 = *(ulong *)(uVar32 + 0xb0);
    uVar64 = *(ulong *)(uVar32 + 0xb8);
    uVar41 = *(ulong *)*(undefined1 (*) [16])(uVar32 + 0xc0);
    local_88 = *(undefined1 (*) [16])(uVar32 + 0xc0);
    uVar66 = *(ulong *)(uVar32 + 0x110);
    uVar25 = *(ulong *)(uVar32 + 0x118);
    uVar47 = auVar71._0_4_;
    uVar51 = auVar71._8_4_;
    uVar26 = *(ulong *)(uVar32 + 0x100);
    uVar27 = *(ulong *)(uVar32 + 0x108);
    uVar34 = auVar43._0_4_;
    uVar38 = auVar43._8_4_;
    uVar40 = auVar48._0_4_;
    uVar45 = auVar48._8_4_;
    uVar68 = (*(ulong *)(uVar32 + 0xe0) & 0xffffffff) * (local_98 & 0xffffffff) +
             (*(ulong *)(uVar32 + 0xf0) & 0xffffffff) * (ulong)uVar40 +
             (uVar26 & 0xffffffff) * (ulong)uVar34 +
             (uVar66 & 0xffffffff) * (ulong)uVar47 + (uVar36 & 0xffffffff) * (ulong)uVar29;
    uVar69 = (*(ulong *)(uVar32 + 0xe8) & 0xffffffff) * (uStack_90 & 0xffffffff) +
             (*(ulong *)(uVar32 + 0xf8) & 0xffffffff) * (ulong)uVar45 +
             (uVar27 & 0xffffffff) * (ulong)uVar38 +
             (uVar25 & 0xffffffff) * (ulong)uVar51 + (uVar57 & 0xffffffff) * (ulong)uVar31;
    uVar59 = (uVar66 & 0xffffffff) * (local_98 & 0xffffffff) +
             (uVar36 & 0xffffffff) * (ulong)uVar40 + (uVar39 & 0xffffffff) * (ulong)uVar34 +
             (uVar42 & 0xffffffff) * (ulong)uVar47 + (uVar41 & 0xffffffff) * (ulong)uVar29;
    uVar63 = (uVar25 & 0xffffffff) * (uStack_90 & 0xffffffff) +
             (uVar57 & 0xffffffff) * (ulong)uVar45 + (uVar58 & 0xffffffff) * (ulong)uVar38 +
             (uVar64 & 0xffffffff) * (ulong)uVar51 +
             (*(ulong *)(uVar32 + 200) & 0xffffffff) * (ulong)uVar31;
    uVar52 = (uVar68 >> 0x1a) +
             (*(ulong *)(uVar32 + 0xf0) & 0xffffffff) * (local_98 & 0xffffffff) +
             (uVar26 & 0xffffffff) * (ulong)uVar40 + (uVar66 & 0xffffffff) * (ulong)uVar34 +
             (uVar36 & 0xffffffff) * (ulong)uVar47 + (uVar39 & 0xffffffff) * (ulong)uVar29;
    uVar56 = (uVar69 >> 0x1a) +
             (*(ulong *)(uVar32 + 0xf8) & 0xffffffff) * (uStack_90 & 0xffffffff) +
             (uVar27 & 0xffffffff) * (ulong)uVar45 + (uVar25 & 0xffffffff) * (ulong)uVar38 +
             (uVar57 & 0xffffffff) * (ulong)uVar51 + (uVar58 & 0xffffffff) * (ulong)uVar31;
    uVar41 = (uVar59 >> 0x1a) +
             (uVar36 & 0xffffffff) * (local_98 & 0xffffffff) + (uVar39 & 0xffffffff) * (ulong)uVar40
             + (uVar42 & 0xffffffff) * (ulong)uVar34 + (uVar41 & 0xffffffff) * (ulong)uVar47 +
             (ulong)uVar29 * (ulong)*(uint *)(uVar32 + 0xd0);
    uVar46 = (uVar63 >> 0x1a) +
             (uVar57 & 0xffffffff) * (uStack_90 & 0xffffffff) +
             (uVar58 & 0xffffffff) * (ulong)uVar45 +
             (uVar64 & 0xffffffff) * (ulong)uVar38 +
             (*(ulong *)(uVar32 + 200) & 0xffffffff) * (ulong)uVar51 +
             (auVar37._8_8_ & 0xffffffff) * (ulong)*(uint *)(uVar32 + 0xd8);
    uVar36 = (uVar52 >> 0x1a) +
             (uVar26 & 0xffffffff) * (local_98 & 0xffffffff) +
             (uVar66 & 0xffffffff) * (ulong)uVar40 + (uVar42 & 0xffffffff) * (ulong)uVar29 +
             (uVar36 & 0xffffffff) * (ulong)uVar34 + (uVar39 & 0xffffffff) * (ulong)uVar47;
    uVar39 = (uVar56 >> 0x1a) +
             (uVar27 & 0xffffffff) * (uStack_90 & 0xffffffff) +
             (uVar25 & 0xffffffff) * (ulong)uVar45 + (uVar64 & 0xffffffff) * (ulong)uVar31 +
             (uVar57 & 0xffffffff) * (ulong)uVar38 + (uVar58 & 0xffffffff) * (ulong)uVar51;
    uVar57 = (uVar41 >> 0x1a & 0xffffffff) * 5 + (uVar68 & 0x3ffffff);
    uVar58 = (uVar46 >> 0x1a & 0xffffffff) * 5 + (uVar69 & 0x3ffffff);
    uVar64 = (uVar36 >> 0x1a) + (uVar59 & 0x3ffffff);
    uVar66 = (uVar39 >> 0x1a) + (uVar63 & 0x3ffffff);
    uVar42 = (uVar58 & 0x3ffffff) + (uVar57 & 0x3ffffff);
    uVar57 = (long)(int)((int)((uVar58 >> 0x1a) + (uVar56 & 0x3ffffff)) +
                        (int)(uVar57 >> 0x1a) + ((uint)uVar52 & 0x3ffffff)) + (uVar42 >> 0x1a);
    uVar39 = (uVar39 & 0x3ffffff) + (uVar36 & 0x3ffffff) + (uVar57 >> 0x1a);
    uVar36 = (uVar66 & 0x3ffffff) + (uVar64 & 0x3ffffff) + (uVar39 >> 0x1a);
    uVar29 = (uint)uVar36;
    uVar58 = (long)(int)((int)((uVar66 >> 0x1a) + (uVar46 & 0x3ffffff)) +
                        (int)(uVar64 >> 0x1a) + ((uint)uVar41 & 0x3ffffff)) + (uVar36 >> 0x1a);
    uVar42 = (uVar58 >> 0x1a) * 5 + (ulong)((uint)uVar42 & 0x3ffffff);
    uVar36 = (uVar42 >> 0x1a) + (uVar57 & 0x3ffffff);
    *(ulong *)(uVar32 + 0x120) = uVar36 * 0x4000000 & 0xffffc000000 | uVar42 & 0x3ffffff;
    *(ulong *)(uVar32 + 0x128) =
         (ulong)(uVar29 & 0x3ff) << 0x22 | (uVar39 & 0x3ffffff) << 8 | uVar36 >> 0x12;
    *(ulong *)(uVar32 + 0x130) =
         uVar58 * 0x10000 & 0x3ffffff0000 | (ulong)((uVar29 & 0x3fffc00) >> 10);
    uVar30 = uVar30 - lVar28;
    puVar35 = (ulong *)((long)puVar35 + lVar28);
  }
  uVar36 = *(ulong *)(uVar32 + 0x120);
  uVar57 = *(ulong *)(uVar32 + 0x128);
  uVar39 = *(ulong *)(uVar32 + 0x130);
  uVar42 = CONCAT44(*(undefined4 *)(uVar32 + 0x9c),*(undefined4 *)(uVar32 + 0x94));
  uVar64 = CONCAT44(*(undefined4 *)(uVar32 + 0xac),*(undefined4 *)(uVar32 + 0xa4));
  uVar41 = CONCAT44(*(undefined4 *)(uVar32 + 0xbc),*(undefined4 *)(uVar32 + 0xb4));
  uVar58 = uVar41 * 0x14;
  if (uVar30 < 0x10) goto LAB_0049e510;
  do {
    local_88._0_8_ = puVar35;
    uVar36 = (*puVar35 & 0xfffffffffff) + uVar36;
    uVar57 = (*puVar35 >> 0x2c | (puVar35[1] & 0xffffff) << 0x14) + uVar57;
    uVar39 = uVar39 + 0x10000000000 + (puVar35[1] >> 0x18);
    local_98 = uVar30;
    while( true ) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar36;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar42;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar57;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar58;
      auVar20._8_8_ = SUB168(auVar3 * auVar12,8);
      auVar20._0_8_ = SUB168(auVar3 * auVar12,0) & 0xfffffffffffffffc;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar39;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar64 * 0x14;
      auVar21._8_8_ = SUB168(auVar4 * auVar13,8);
      auVar21._0_8_ = SUB168(auVar4 * auVar13,0) & 0xfffffffffffffffc;
      auVar21 = auVar2 * auVar11 + auVar20 + auVar21;
      uVar30 = auVar21._0_8_;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar36;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar64;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar57;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar42;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar39;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar58;
      auVar22._8_8_ = SUB168(auVar7 * auVar16,8);
      auVar22._0_8_ = SUB168(auVar7 * auVar16,0) & 0xfffffffffffffffc;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar36;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar41;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar57;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar64;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar39;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar42;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = auVar21._8_8_ << 0x14 | uVar30 >> 0x2c;
      auVar23 = auVar6 * auVar15 + auVar5 * auVar14 + auVar22 + auVar23;
      uVar57 = auVar23._0_8_;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = auVar23._8_8_ << 0x14 | uVar57 >> 0x2c;
      uVar57 = uVar57 & 0xfffffffffff;
      auVar24 = auVar9 * auVar18 + auVar8 * auVar17 + auVar10 * auVar19 + auVar24;
      uVar39 = auVar24._0_8_;
      uVar36 = (auVar24._8_8_ << 0x16 | uVar39 >> 0x2a) * 5 + (uVar30 & 0xfffffffffff);
      uVar39 = uVar39 & 0x3ffffffffff;
      puVar35 = (ulong *)(local_88._0_8_ + 0x10);
      uVar30 = local_98 - 0x10;
      if (0xf < uVar30) break;
LAB_0049e510:
      if (uVar30 == 0) {
        uVar57 = (uVar36 >> 0x2c) + uVar57;
        uVar58 = uVar57 & 0xfffffffffff;
        uVar39 = (uVar57 >> 0x2c) + uVar39;
        lVar28 = (uVar39 >> 0x2a) * 5;
        uVar30 = lVar28 + (uVar36 & 0xfffffffffff) + 5;
        uVar64 = (uVar30 >> 0x2c) + uVar58;
        uVar41 = (uVar64 >> 0x2c) + (uVar39 & 0x3ffffffffff);
        uVar66 = (long)(uVar41 - 0x40000000000) >> 0x3f;
        uVar42 = 0xffffffffffffffff - uVar66 & 0xfffffffffff;
        uVar57 = (ulong)*(uint *)(uVar32 + 0xcc) << 0x20;
        uVar1 = *(undefined4 *)(uVar32 + 0xdc);
        uVar29 = *(uint *)(uVar32 + 0xd4);
        uVar32 = (uVar57 & 0xfff00000000 | (ulong)*(uint *)(uVar32 + 0xc4)) +
                 (uVar30 & uVar42 | lVar28 + (uVar36 & 0xfffffffffff) & uVar66);
        uVar30 = (uVar57 >> 0x2c | ((ulong)uVar29 & 0xffffff) << 0x14) +
                 (uVar42 & uVar64 | uVar58 & uVar66) + (uVar32 >> 0x2c);
        *(ulong *)mac = uVar30 << 0x2c | uVar32 & 0xfffffffffff;
        *(ulong *)(mac + 8) =
             ((CONCAT44(uVar1,uVar29) >> 0x18) +
              (0xffffffffffffffff - uVar66 & uVar41 | uVar66 & uVar39) + (uVar30 >> 0x2c)) *
             0x1000000 | (ulong)((uint)(uVar30 >> 0x14) & 0xffffff);
        return;
      }
      *(undefined1 *)((long)puVar35 + uVar30) = 1;
      if (uVar30 != 0xf) {
        memset((void *)((long)puVar35 + uVar30 + 1),0,uVar30 ^ 0xf);
      }
      local_88._0_8_ = puVar35;
      uVar36 = (*puVar35 & 0xfffffffffff) + uVar36;
      uVar57 = (*puVar35 >> 0x2c | (puVar35[1] & 0xffffff) << 0x14) + uVar57;
      uVar39 = (puVar35[1] >> 0x18) + uVar39;
      local_98 = 0x10;
    }
  } while( true );
}

Assistant:

void CRYPTO_poly1305_finish(poly1305_state *state, uint8_t mac[16]) {
  poly1305_state_internal *st = poly1305_aligned_state(state);
  size_t leftover = st->leftover;
  uint8_t *m = st->buffer;
  uint128_t d[3];
  uint64_t h0, h1, h2;
  uint64_t t0, t1;
  uint64_t g0, g1, g2, c, nc;
  uint64_t r0, r1, r2, s1, s2;
  poly1305_power *p;

  if (st->started) {
    size_t consumed = poly1305_combine(st, m, leftover);
    leftover -= consumed;
    m += consumed;
  }

  // st->HH will either be 0 or have the combined result
  h0 = st->HH[0];
  h1 = st->HH[1];
  h2 = st->HH[2];

  p = &st->P[1];
  r0 = ((uint64_t)p->R20.d[3] << 32) | (uint64_t)p->R20.d[1];
  r1 = ((uint64_t)p->R21.d[3] << 32) | (uint64_t)p->R21.d[1];
  r2 = ((uint64_t)p->R22.d[3] << 32) | (uint64_t)p->R22.d[1];
  s1 = r1 * (5 << 2);
  s2 = r2 * (5 << 2);

  if (leftover < 16) {
    goto poly1305_donna_atmost15bytes;
  }

poly1305_donna_atleast16bytes:
  t0 = CRYPTO_load_u64_le(m + 0);
  t1 = CRYPTO_load_u64_le(m + 8);
  h0 += t0 & 0xfffffffffff;
  t0 = shr128_pair(t1, t0, 44);
  h1 += t0 & 0xfffffffffff;
  h2 += (t1 >> 24) | ((uint64_t)1 << 40);

poly1305_donna_mul:
  d[0] = add128(add128(mul64x64_128(h0, r0), mul64x64_128(h1, s2)),
                mul64x64_128(h2, s1));
  d[1] = add128(add128(mul64x64_128(h0, r1), mul64x64_128(h1, r0)),
                mul64x64_128(h2, s2));
  d[2] = add128(add128(mul64x64_128(h0, r2), mul64x64_128(h1, r1)),
                mul64x64_128(h2, r0));
  h0 = lo128(d[0]) & 0xfffffffffff;
  c = shr128(d[0], 44);
  d[1] = add128_64(d[1], c);
  h1 = lo128(d[1]) & 0xfffffffffff;
  c = shr128(d[1], 44);
  d[2] = add128_64(d[2], c);
  h2 = lo128(d[2]) & 0x3ffffffffff;
  c = shr128(d[2], 42);
  h0 += c * 5;

  m += 16;
  leftover -= 16;
  if (leftover >= 16) {
    goto poly1305_donna_atleast16bytes;
  }

// final bytes
poly1305_donna_atmost15bytes:
  if (!leftover) {
    goto poly1305_donna_finish;
  }

  m[leftover++] = 1;
  OPENSSL_memset(m + leftover, 0, 16 - leftover);
  leftover = 16;

  t0 = CRYPTO_load_u64_le(m + 0);
  t1 = CRYPTO_load_u64_le(m + 8);
  h0 += t0 & 0xfffffffffff;
  t0 = shr128_pair(t1, t0, 44);
  h1 += t0 & 0xfffffffffff;
  h2 += (t1 >> 24);

  goto poly1305_donna_mul;

poly1305_donna_finish:
  c = (h0 >> 44);
  h0 &= 0xfffffffffff;
  h1 += c;
  c = (h1 >> 44);
  h1 &= 0xfffffffffff;
  h2 += c;
  c = (h2 >> 42);
  h2 &= 0x3ffffffffff;
  h0 += c * 5;

  g0 = h0 + 5;
  c = (g0 >> 44);
  g0 &= 0xfffffffffff;
  g1 = h1 + c;
  c = (g1 >> 44);
  g1 &= 0xfffffffffff;
  g2 = h2 + c - ((uint64_t)1 << 42);

  c = (g2 >> 63) - 1;
  nc = ~c;
  h0 = (h0 & nc) | (g0 & c);
  h1 = (h1 & nc) | (g1 & c);
  h2 = (h2 & nc) | (g2 & c);

  // pad
  t0 = ((uint64_t)p->R23.d[3] << 32) | (uint64_t)p->R23.d[1];
  t1 = ((uint64_t)p->R24.d[3] << 32) | (uint64_t)p->R24.d[1];
  h0 += (t0 & 0xfffffffffff);
  c = (h0 >> 44);
  h0 &= 0xfffffffffff;
  t0 = shr128_pair(t1, t0, 44);
  h1 += (t0 & 0xfffffffffff) + c;
  c = (h1 >> 44);
  h1 &= 0xfffffffffff;
  t1 = (t1 >> 24);
  h2 += (t1) + c;

  CRYPTO_store_u64_le(mac + 0, ((h0) | (h1 << 44)));
  CRYPTO_store_u64_le(mac + 8, ((h1 >> 20) | (h2 << 24)));
}